

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cRGB555,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  EBlend EVar4;
  FSpecialColormap *pFVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  BYTE BVar14;
  int iVar15;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0058cf1e_caseD_0:
    lVar9 = 0;
    if (count < 1) {
      count = 0;
    }
    for (; count != (int)lVar9; lVar9 = lVar9 + 1) {
      iVar12 = (int)((*(ushort *)pin & 0x1f) * 8 * inf->alpha + (uint)pout[lVar9 * 4 + 2] * 0x10000)
               >> 0x10;
      if (0xfe < iVar12) {
        iVar12 = 0xff;
      }
      pout[lVar9 * 4 + 2] = (BYTE)iVar12;
      iVar12 = (int)((*(ushort *)pin >> 2 & 0xf8) * inf->alpha + (uint)pout[lVar9 * 4 + 1] * 0x10000
                    ) >> 0x10;
      if (0xfe < iVar12) {
        iVar12 = 0xff;
      }
      pout[lVar9 * 4 + 1] = (BYTE)iVar12;
      iVar12 = (int)((*(ushort *)pin >> 7 & 0xf8) * inf->alpha + (uint)pout[lVar9 * 4] * 0x10000) >>
               0x10;
      if (0xfe < iVar12) {
        iVar12 = 0xff;
      }
      pout[lVar9 * 4] = (BYTE)iVar12;
      pout[lVar9 * 4 + 3] = 0xff;
      pin = (BYTE *)((long)pin + (long)step);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0058cf1e_caseD_0;
    case BLEND_ICEMAP:
      lVar9 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar9; lVar9 = lVar9 + 1) {
        iVar12 = cRGB555::Gray(pin);
        iVar12 = iVar12 >> 4;
        iVar7 = (int)((uint)IcePalette[iVar12][0] * inf->alpha + (uint)pout[lVar9 * 4 + 2] * 0x10000
                     ) >> 0x10;
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        pout[lVar9 * 4 + 2] = (BYTE)iVar7;
        iVar7 = (int)((uint)IcePalette[iVar12][1] * inf->alpha + (uint)pout[lVar9 * 4 + 1] * 0x10000
                     ) >> 0x10;
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        pout[lVar9 * 4 + 1] = (BYTE)iVar7;
        iVar12 = (int)((uint)IcePalette[iVar12][2] * inf->alpha + (uint)pout[lVar9 * 4] * 0x10000)
                 >> 0x10;
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        pout[lVar9 * 4] = (BYTE)iVar12;
        pout[lVar9 * 4 + 3] = 0xff;
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      lVar9 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar9; lVar9 = lVar9 + 1) {
        uVar3 = *(ushort *)pin;
        iVar12 = inf->blendcolor[3];
        iVar7 = inf->blendcolor[1];
        iVar13 = inf->blendcolor[2];
        iVar15 = (((uint)uVar3 * 8 & 0xff) * iVar12 + inf->blendcolor[0] >> 0x10 & 0xff) *
                 inf->alpha + (uint)pout[lVar9 * 4 + 2] * 0x10000;
        BVar14 = (BYTE)((uint)iVar15 >> 0x10);
        if (0xfe < iVar15 >> 0x10) {
          BVar14 = 0xff;
        }
        pout[lVar9 * 4 + 2] = BVar14;
        iVar7 = ((uVar3 >> 2 & 0xf8) * iVar12 + iVar7 >> 0x10 & 0xff) * inf->alpha +
                (uint)pout[lVar9 * 4 + 1] * 0x10000;
        BVar14 = (BYTE)((uint)iVar7 >> 0x10);
        if (0xfe < iVar7 >> 0x10) {
          BVar14 = 0xff;
        }
        pout[lVar9 * 4 + 1] = BVar14;
        iVar12 = ((uVar3 >> 7 & 0xf8) * iVar12 + iVar13 >> 0x10 & 0xff) * inf->alpha +
                 (uint)pout[lVar9 * 4] * 0x10000;
        BVar14 = (BYTE)((uint)iVar12 >> 0x10);
        if (0xfe < iVar12 >> 0x10) {
          BVar14 = 0xff;
        }
        pout[lVar9 * 4] = BVar14;
        pout[lVar9 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
      }
      break;
    case BLEND_MODULATE:
      lVar9 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar9; lVar9 = lVar9 + 1) {
        uVar3 = *(ushort *)pin;
        iVar12 = (int)((((uint)uVar3 * 8 & 0xff) * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar9 * 4 + 2] * 0x10000) >> 0x10;
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        iVar7 = inf->blendcolor[1];
        iVar13 = inf->blendcolor[2];
        pout[lVar9 * 4 + 2] = (BYTE)iVar12;
        iVar12 = (int)(((uVar3 >> 2 & 0xf8) * iVar7 >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar9 * 4 + 1] * 0x10000) >> 0x10;
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        pout[lVar9 * 4 + 1] = (BYTE)iVar12;
        iVar12 = (int)(((uVar3 >> 7 & 0xf8) * iVar13 >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar9 * 4] * 0x10000) >> 0x10;
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        pout[lVar9 * 4] = (BYTE)iVar12;
        pout[lVar9 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
      }
      break;
    default:
      EVar4 = inf->blend;
      lVar9 = (long)EVar4;
      if (lVar9 < 0x21) {
        if (BLEND_ICEMAP < EVar4) {
          iVar12 = 0x20 - EVar4;
          lVar9 = 0;
          if (count < 1) {
            count = 0;
          }
          for (; count != (int)lVar9; lVar9 = lVar9 + 1) {
            iVar7 = cRGB555::Gray(pin);
            uVar3 = *(ushort *)pin;
            iVar7 = iVar7 * (EVar4 + BLEND_MODULATE);
            iVar13 = ((int)(((uint)uVar3 * 8 & 0xff) * iVar12 + iVar7) / 0x1f & 0xffU) * inf->alpha
                     + (uint)pout[lVar9 * 4 + 2] * 0x10000;
            BVar14 = (BYTE)((uint)iVar13 >> 0x10);
            if (0xfe < iVar13 >> 0x10) {
              BVar14 = 0xff;
            }
            pout[lVar9 * 4 + 2] = BVar14;
            iVar13 = ((int)((uVar3 >> 2 & 0xf8) * iVar12 + iVar7) / 0x1f & 0xffU) * inf->alpha +
                     (uint)pout[lVar9 * 4 + 1] * 0x10000;
            BVar14 = (BYTE)((uint)iVar13 >> 0x10);
            if (0xfe < iVar13 >> 0x10) {
              BVar14 = 0xff;
            }
            pout[lVar9 * 4 + 1] = BVar14;
            iVar7 = ((int)((uVar3 >> 7 & 0xf8) * iVar12 + iVar7) / 0x1f & 0xffU) * inf->alpha +
                    (uint)pout[lVar9 * 4] * 0x10000;
            BVar14 = (BYTE)((uint)iVar7 >> 0x10);
            if (0xfe < iVar7 >> 0x10) {
              BVar14 = 0xff;
            }
            pout[lVar9 * 4] = BVar14;
            pout[lVar9 * 4 + 3] = 0xff;
            pin = (BYTE *)((long)pin + (long)step);
          }
        }
      }
      else {
        if (count < 1) {
          count = 0;
        }
        for (lVar11 = 0; count != (int)lVar11; lVar11 = lVar11 + 1) {
          uVar6 = cRGB555::Gray(pin);
          uVar8 = 0xff;
          if (uVar6 < 0xff) {
            uVar8 = uVar6;
          }
          if ((int)uVar6 < 1) {
            uVar8 = 0;
          }
          uVar10 = (ulong)uVar8;
          iVar12 = (int)((uint)*(byte *)((long)pFVar5 + uVar10 * 4 + lVar9 * 0x518 + -0xa6fe) *
                         inf->alpha + (uint)pout[lVar11 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          bVar1 = *(byte *)((long)pFVar5 + uVar10 * 4 + lVar9 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar5 + uVar10 * 4 + lVar9 * 0x518 + -0xa6ff);
          pout[lVar11 * 4 + 2] = (BYTE)iVar12;
          iVar12 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar11 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          pout[lVar11 * 4 + 1] = (BYTE)iVar12;
          iVar12 = (int)((uint)bVar1 * inf->alpha + (uint)pout[lVar11 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          pout[lVar11 * 4] = (BYTE)iVar12;
          pout[lVar11 * 4 + 3] = 0xff;
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}